

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_io_dp.c
# Opt level: O0

int appendDynamic(dynamicPtr *dp,void *src,int size)

{
  int iVar1;
  int iVar2;
  char *tmp;
  int bytesNeeded;
  int size_local;
  void *src_local;
  dynamicPtr *dp_local;
  
  if (dp->dataGood == 0) {
    return 0;
  }
  iVar1 = dp->pos + size;
  if (dp->realSize < iVar1) {
    if (dp->freeOK == 0) {
      return 0;
    }
    iVar2 = overflow2(dp->realSize,2);
    if (iVar2 != 0) {
      return 0;
    }
    iVar1 = gdReallocDynamic(dp,iVar1 * 2);
    if (iVar1 == 0) {
      dp->dataGood = 0;
      return 0;
    }
  }
  memcpy((void *)((long)dp->data + (long)dp->pos),src,(long)size);
  dp->pos = size + dp->pos;
  if (dp->logicalSize < dp->pos) {
    dp->logicalSize = dp->pos;
  }
  return 1;
}

Assistant:

static int appendDynamic(dynamicPtr * dp, const void *src, int size)
{
	int bytesNeeded;
	char *tmp;

	if(!dp->dataGood) {
		return FALSE;
	}

	/* bytesNeeded = dp->logicalSize + size; */
	bytesNeeded = dp->pos + size;

	if(bytesNeeded > dp->realSize) {
		/* 2.0.21 */
		if(!dp->freeOK) {
			return FALSE;
		}

		if(overflow2(dp->realSize, 2)) {
			return FALSE;
		}

		if(!gdReallocDynamic(dp, bytesNeeded * 2)) {
			dp->dataGood = FALSE;
			return FALSE;
		}
	}

	/* if we get here, we can be sure that we have enough bytes
	 * to copy safely */

	/*printf("Mem OK Size: %d, Pos: %d\n", dp->realSize, dp->pos); */

	tmp = (char *)dp->data;
	memcpy ((void *)(tmp + (dp->pos)), src, size);
	dp->pos += size;

	if(dp->pos > dp->logicalSize) {
		dp->logicalSize = dp->pos;
	};

	return TRUE;
}